

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void gwaelin(dw_rom *rom)

{
  dw_rom *rom_local;
  
  vpatch(rom,0x87da,2,0xe,0x1b);
  vpatch(rom,0x1335,0xf,3,0,0x43,2,3,3,3,0,3,0,0x43,3,0x43,2,0x43);
  vpatch(rom,0x1395,0xf,3,0xc,0x43,0xf,0x43,0xe,0x43,0xc,3,0xc,0x43,0xe,3,0xf,3);
  vpatch(rom,0x1415,0xf,3,0xc5,3,0xc6,3,199,3,0xc4,3,200,3,0xc9,3,0xca,3);
  vpatch(rom,0x1435,0xf,3,5,3,6,3,7,3,4,3,5,3,8,3,9,3);
  vpatch(rom,0x1495,0xf,3,0x11,3,0x14,3,0x15,3,0x10,3,0x11,3,0x12,3,0x13,3);
  vpatch(rom,0x1515,0xf,3,0xcb,3,0xcc,3,0xcd,3,0xce,3,0xcf,3,0xd0,3,0xd1,3);
  vpatch(rom,0x1535,0xf,3,1,0x43,10,3,0xb,3,1,3,1,0x43,0xb,0x43,10,0x43);
  vpatch(rom,0x1595,0xf,3,0xd,0x43,0x16,3,0x17,3,0xd,3,0xd,0x43,0x17,0x43,0x16,0x43);
  vpatch(rom,0x1615,0xf,3,0xd3,3,0xd4,3,0xd5,3,0xd6,3,0xd3,3,0xd7,3,0x92,3);
  vpatch(rom,0x1635,0xf,0x43,4,0x43,7,0x43,6,0x43,5,0x43,4,0x43,9,0x43,8,0x43);
  vpatch(rom,0x1695,0xf,0x43,0x10,0x43,0x15,0x43,0x14,0x43,0x11,0x43,0x10,0x43,0x13,0x43,0x12,0x43);
  vpatch(rom,0x1715,0xf,3,0xd1,3,0xd2,3,0xd3,3,0xd4,3,0xd5,3,0xd6,3,0xd7,3);
  vpatch(rom,0x1375,0xf,0,0x72,0,0x74,0,0x76,0,0x88,0,0x89,0,0x8a,0,0x8b,0);
  vpatch(rom,0x1475,0xf,0,0x72,0,0x74,0,0x76,0,0x88,0,0x89,0,0x8a,0,0x8b,0);
  vpatch(rom,0x1575,0xf,0,0x72,0,0x74,0,0x76,0,0x88,0,0x89,0,0x8a,0,0x8b,0);
  vpatch(rom,0x1675,0xf,0,0x72,0,0x74,0,0x76,0,0x88,0,0x89,0,0x8a,0,0x8b,0);
  vpatch(rom,0x188a,5,0x33,0x52,0x2d,0xcf,0x58);
  vpatch(rom,0x1a8d,1,7);
  vpatch(rom,0x1a96,1,0x12);
  vpatch(rom,0x7b7e,6,0x1e,0x12,0x16,0x18,0x17,0xd);
  vpatch(rom,0x8fbc,0xb,0x5f,0x2a,0x1e,0x12,0x16,0x18,0x17,0xd,0x52,0x5f,0x5f);
  vpatch(rom,0x941d,0x24,0x5f,0x2a,0x1e,0x12,0x16,0x18,0x17,0xd,0x5f,0x12,0x1c,0x5f,0x11,0x12,0xd,
         0xd,0xe,0x17,0x5f,10,0x20,10,0x22,0x5f,0x12,0x17,0x5f,10,0x5f,0xc,10,0x1f,0xe,0x52,0x5f,
         0x5f);
  vpatch(rom,0x9523,0x24,0x5f,0x20,10,0x1c,0x5f,0x14,0x12,0xd,0x17,10,0x19,0x19,0xe,0xd,0x5f,10,0x17
         ,0xd,0x5f,0x1d,10,0x14,0xe,0x17,0x5f,0xe,10,0x1c,0x1d,0x20,10,0x1b,0xd,0x52,0x5f,0x5f);
  vpatch(rom,0x9e5c,0xc,0x5f,0x2a,0x1e,0x12,0x16,0x18,0x17,0xd,0x4b,0x40,0x5f,0x5f);
  vpatch(rom,0x9e89,3,0x52,0x5f);
  vpatch(rom,0x9e9e,6,0x1e,0x12,0x16,0x18,0x17,0xd);
  vpatch(rom,0x9ee1,8,0x18,0x17,0x15,0x22,0x5f,0x22,0x18,0x17);
  vpatch(rom,0xa012,3,0x52,0x5f);
  vpatch(rom,0xa46c,0x10,0x1e,0x12,0x16,0x18,0x17,0xd,0x48,0x5f,0x18,0x17,0x15,0x22,0x5f,0x1c,0x18,
         0x17);
  vpatch(rom,0xa49f,0x19,0x5f,0x2a,0x1e,0x12,0x16,0x18,0x17,0xd,0x5f,0xe,0x16,0xb,0x1b,10,0xc,0xe,
         0x1c,0x5f,0x1d,0x11,0xe,0xe,0x47,0x5f,0x5f);
  vpatch(rom,0xa4fb,8,0x18,0x17,0x15,0x22,0x5f,0x1c,0x18,0x17);
  vpatch(rom,0xa511,2,0x12,0x1c);
  vpatch(rom,0xa537,6,0x1e,0x12,0x16,0x18,0x17,0xd);
  vpatch(rom,0xa552,6,0x1e,0x12,0x16,0x18,0x17,0xd);
  vpatch(rom,0xabaf,6,0x1e,0x12,0x16,0x18,0x17,0xd);
  vpatch(rom,0xb540,6,0x1e,0x12,0x16,0x18,0x17,0xd);
  vpatch(rom,0xb9dd,6,0x1e,0x12,0x16,0x18,0x17,0xd);
  vpatch(rom,0x11a90,0x40,0xe4,0xf8,0x1b,0,0x65,0x4d,7,0x31,0xcf,199,0xe4,0xf,0xea,0xf2,0xf8,0xe,
         0xf0,0xfb,0x60,4,0xec,0xef,0xe,0,0x8f,0x94,0x9f,0x1b,0xf3,0xe1,0xe1,0xe,0x37,0x1f,0xd8,0,
         0xaf,0xb3,0xe0,0x84,0xf3,0xe3,0x27,0xf0,0x5f,0x4f,0x1f,0x78,0xf,0xd7,6,0x20,0x37,0xff,0x70,
         0,0xf1,0x21,0xf1,0xd8,0xcf,0x8f,0x8f,0x70);
  vpatch(rom,0x12180,0x40,2,6,6,0xe,6,0x3f,0x7f,0x1f,0x23,0x3f,0x1f,0xf,0xf,0x3f,0x7f,0x3f,7,0xe,2,
         0x1f,0xf,0xf,0xf,0x1f,7,0xf,0x1f,0x1f,5,4,1,3,0xf,100,0x6f,0x1b,0x13,0xe,0xe,0,0x7f,0xf,0xf
         ,0x1f,0x1f,0,0xe,0,0xf0,0x26,0xf6,0xd8,200,0,0xf0,0xf0,0xfe,0xf0,0xf0,0xf8,0xf8,0xf0,0,0xf0
        );
  vpatch(rom,0x12200,0x20,3,0xf,0xf,0x1f,0x1f,0x1f,0x1f,0x1f,7,0x1f,0xf,0x1f,0x1f,0x1f,0x1f,0x1f,
         0xc0,0xf0,0xf0,0xf8,0xf8,0xf8,0xf8,0xf8,0xe0,0xf8,0xf0,0xf8,0xf8,0xf8,0xf8,0xf8);
  vpatch(rom,0x12240,0x60,0x2f,0x27,0x10,7,2,2,4,4,0x1f,0x1f,0xf,7,0xf,0x1f,0x1f,0x3f,0xf0,0xe4,0xc,
         0xec,0x4c,0x20,0x20,0x10,0xf8,0xf8,0xf0,0xe0,0xf0,0xf8,0xf8,0xf8,7,0xd,0x1e,0x1d,0x3f,0x3f,
         0x3f,0x3f,7,0xf,0x1f,0x1f,0x3f,0x3f,0x3e,0x3f,0x40,0x80,0x60,0xf0,0xf0,0xe0,0xe0,0xe0,0xe0,
         0xe0,0xe0,0xf0,0xd0,0x40,0x40,0,0x1c,0x1b);
  vpatch(rom,0x12300,0x280,7,0xd,0x1e,0x1d,0x3f,0x3f,0x3f,0x3f,7,0xf,0x1f,0x1f,0x3f,0x3f,0x3e,0x3f,
         0x40,0x80,0x60,0xf0,0xf0,0xe0,0xe0,0xe0,0xe0,0xe0,0xe0,0xf0,0xd0,0x40,0x40,0,0x1c,0x1b,2,7,
         3,2,4,4,0x1f,0x1c,0xd,4,0xc,0x1f,0x1f,0x3f,0xc0,0x60,0,0xe0,0x40,0x20,0x20,0x10,0x80,0xe0,
         0xe0,0xe0,0xf0,0xf0,0xf8,0xf8,2,0xc);
  vpatch(rom,0x12600,0x10,3,0xf,0xf,0x1f,0x1f,0x1f,0x1f,0x1f,7,0x1f,0xf,0x1f,0x1f,0x1f,0x1f,0x1f);
  vpatch(rom,0x12620,0x10,0x2f,0x27,0x10,7,2,2,4,4,0x1f,0x1f,0xf,7,0xf,0x1f,0x1f,0x3f);
  vpatch(rom,0x12640,0x10,3,0xf,0xf,0x1f,0x1f,0x1f,0x1f,0x1f,7,0x1f,0xf,0x1f,0x1f,0x1f,0x1f,0x1f);
  vpatch(rom,0x12661,0xf,199,0xd0,0x37,0x32,4,4,8,0x7f,0x7f,0xef,199,0xf,0x1f,0x1f,0x3f);
  vpatch(rom,0x12710,0x10,0x40,0x30,0xc0,0xf0,0xf8,0xf8,0xf8,0xf8,0xe0,0xf8,0xf0,0xf8,0xf8,0x58,0x48
         ,0x18);
  vpatch(rom,0x12731,0xf,0xdc,0x1c,0xdc,0x40,0x20,0x20,0x10,0x7e,0xf6,0xf6,0xfe,0xfc,0xf8,0xfc,0xfe)
  ;
  vpatch(rom,0x12750,0x10,0x40,0x30,0xc0,0xf0,0xf8,0xf8,0xf8,0xf6,0xe0,0xf8,0xf0,0xf8,0xf8,0x58,0x4e
         ,0x1e);
  vpatch(rom,0x12770,0x10,0xc3,0xc3,0xb,0xe0,0x40,0x40,0x20,0x20,0x7e,0xfe,0xf7,0xe3,0xf0,0xf8,0xf8,
         0xfc);
  vpatch(rom,0x12800,0x10,3,0xf,0xf,0x1f,0x1f,0x1f,0x1f,0x1f,7,0x1f,0xf,0x1f,0x1f,0x1f,0x1f,0x1f);
  vpatch(rom,0x12820,0x10,0x2f,0x27,0x10,7,2,2,4,4,0x1f,0x1f,0x2f,7,0xf,0x1f,0x1f,0x3f);
  vpatch(rom,0x12840,0xf,3,0xf,0xf,0x1f,0x1f,0x1f,0x1f,0xdf,7,0x1f,0xf,0x1f,0x1f,0x1f,0xdf);
  vpatch(rom,0x12861,0xf,199,0xd0,0x37,0x22,4,4,8,0x7f,0x7f,0xef,199,0xf,0x1f,0x1f,0x3f);
  vpatch(rom,0x12910,0x10,0x40,0x30,0xc0,0xf0,0xf8,0xf8,0xf8,0xf0,0xe0,0xf8,0xf0,0xf8,0xf8,0x58,0x48
         ,0x1e);
  vpatch(rom,0x12930,0x10,0xce,0xce,0xe,0xee,0x40,0x20,0x20,0x10,0x7f,0xfb,0xfb,0xff,0xfe,0xf0,0xf8,
         0xfc);
  vpatch(rom,0x12950,0x10,0x40,0x30,0xc0,0xf0,0xf8,0xf8,0xf8,0xfb,0xe0,0xf8,0xf0,0xf8,0xf8,0x58,0x4b
         ,0x1f);
  vpatch(rom,0x12970,0x90,0xc3,0xc3,0xb,0xe0,0x40,0x40,0x20,0x20,0x7e,0xfe,0xf7,0xe3,0xf0,0xf8,0xf8,
         0xfc,2,1,6,0xf,0xf,7,7,3,7,7,7,0xf,0xb,2,2,0xc,0xe0,0xb0,0x78,0xb8,0xfc,0xfc,0xfc,0xfc,0xe0
         ,0xf0,0xf8,0xf8,0xfc,0xfc,0x7c,0xfc,0xd,0xd,0xd,0xd,2,2,4,4,0xe,6,6,0xf,0xf,0xf,0x1f,0x1f,
         0x38,0xd8);
  vpatch(rom,0x12a20,0x7b,0x2f,0xa7,0xd0,0x47,2,4,4,8,0x5f,0x5f,0x2f,7,0xf,0x1f,0x1f,0x3f,0xf0,0xe0,
         0xc,0xfc,0x40,0x40,0x20,0x20,0xf8,0xfe,0xf2,0xf0,0xf0,0xf0,0xf8,0xf8,3,0xf,0xf,0x1f,0x1f,
         0x1f,0x1f,0x1f,7,0x1f,0xf,0x1f,0x1f,0x1f,0x1f,0x1f,0xc0,0xf0,0xf0,0xf8,0xf8,0xf8,0xf8,0xf8,
         0xe0,0xfa,0xfe,0xfe,0xfc,0xf8,0xf8,0xf8,0x2f,0x27);
  vpatch(rom,0x12aa0,0x3b,0x60,99,0x43,0x3f,0x2a,0x4a,0x49,0x11,0x7f,0x7c,0x7c,0x3f,0x3f,0x7f,0x7f,
         0xff,0x3c,0xff,0xff,0x44,0xff,0x7c,0,0,0x7e,0xff,0x1f,0xff,0xff,0x7c,0x80,0x80,0x30,0x18,
         0x26,0x1f,0x3f,0x3f,0x3f,0x3f,0x3b,0x3f,0x3f,0x3f,0x3d,0x39,0x38,0x38,0,0x24,0xc,0x8f,0xcf,
         0xff,0xff,0xff,0x99,0xff,0x7e);
  vpatch(rom,0x12ae0,0x20,0x20,0x23,3,0x3f,0x2a,0x2a,0x49,0x11,0x3f,0x3c,0x3c,0x3f,0x3f,0x3f,0x7f,
         0x7f,0x3c,0xff,0xff,0x44,0xff,0x99,0,0,0x7e,0xff,0x1f,0xff,0xff,0xff,0x80,0x80);
  vpatch(rom,0x12b20,0x100,0x6f,0x67,0x3f,0x1f,0xf,0,0,0,0x7e,0x7c,0x1f,0xf,0xf,0xf,0xf,0x1f,0xf0,
         0xf8,0x70,0xe0,0x62,0x16,0xc,0,0x70,0x78,0xf8,0xbc,0x9c,0xf8,0xf8,0xf8,0xc,0x2e,0x67,99,
         0x7f,0x7f,0x3f,0x7f,0x1d,0x3f,0x7f,0x7f,0x7f,0x72,0x32,0x70,0x40,0x30,0xc0,0xf0,0xf8,0xf8,
         0xf8,0xf8,0xe0,0xf8,0xf0,0xf8,0xf8,0x58,0x48,0x18,0x6f,0x67);
  return;
}

Assistant:

static void gwaelin(dw_rom *rom)
{
    vpatch(rom, 0x087da,    2,  0x0e,  0x1b); // his -> her
    vpatch(rom, 0x01335,   15,  0x03,  0x00,  0x43,  0x02,  0x03,  0x03,  0x03,  0x00,  0x03,  0x00,  0x43,  0x03,  0x43,  0x02,  0x43);
    vpatch(rom, 0x01395,   15,  0x03,  0x0c,  0x43,  0x0f,  0x43,  0x0e,  0x43,  0x0c,  0x03,  0x0c,  0x43,  0x0e,  0x03,  0x0f,  0x03);
    vpatch(rom, 0x01415,   15,  0x03,  0xc5,  0x03,  0xc6,  0x03,  0xc7,  0x03,  0xc4,  0x03,  0xc8,  0x03,  0xc9,  0x03,  0xca,  0x03);
    vpatch(rom, 0x01435,   15,  0x03,  0x05,  0x03,  0x06,  0x03,  0x07,  0x03,  0x04,  0x03,  0x05,  0x03,  0x08,  0x03,  0x09,  0x03);
    vpatch(rom, 0x01495,   15,  0x03,  0x11,  0x03,  0x14,  0x03,  0x15,  0x03,  0x10,  0x03,  0x11,  0x03,  0x12,  0x03,  0x13,  0x03);
    vpatch(rom, 0x01515,   15,  0x03,  0xcb,  0x03,  0xcc,  0x03,  0xcd,  0x03,  0xce,  0x03,  0xcf,  0x03,  0xd0,  0x03,  0xd1,  0x03);
    vpatch(rom, 0x01535,   15,  0x03,  0x01,  0x43,  0x0a,  0x03,  0x0b,  0x03,  0x01,  0x03,  0x01,  0x43,  0x0b,  0x43,  0x0a,  0x43);
    vpatch(rom, 0x01595,   15,  0x03,  0x0d,  0x43,  0x16,  0x03,  0x17,  0x03,  0x0d,  0x03,  0x0d,  0x43,  0x17,  0x43,  0x16,  0x43);
    vpatch(rom, 0x01615,   15,  0x03,  0xd3,  0x03,  0xd4,  0x03,  0xd5,  0x03,  0xd6,  0x03,  0xd3,  0x03,  0xd7,  0x03,  0x92,  0x03);
    vpatch(rom, 0x01635,   15,  0x43,  0x04,  0x43,  0x07,  0x43,  0x06,  0x43,  0x05,  0x43,  0x04,  0x43,  0x09,  0x43,  0x08,  0x43);
    vpatch(rom, 0x01695,   15,  0x43,  0x10,  0x43,  0x15,  0x43,  0x14,  0x43,  0x11,  0x43,  0x10,  0x43,  0x13,  0x43,  0x12,  0x43);
    vpatch(rom, 0x01715,   15,  0x03,  0xd1,  0x03,  0xd2,  0x03,  0xd3,  0x03,  0xd4,  0x03,  0xd5,  0x03,  0xd6,  0x03,  0xd7,  0x03);
    vpatch(rom, 0x01375,   15,  0x00,  0x72,  0x00,  0x74,  0x00,  0x76,  0x00,  0x88,  0x00,  0x89,  0x00,  0x8a,  0x00,  0x8b,  0x00);
    vpatch(rom, 0x01475,   15,  0x00,  0x72,  0x00,  0x74,  0x00,  0x76,  0x00,  0x88,  0x00,  0x89,  0x00,  0x8a,  0x00,  0x8b,  0x00);
    vpatch(rom, 0x01575,   15,  0x00,  0x72,  0x00,  0x74,  0x00,  0x76,  0x00,  0x88,  0x00,  0x89,  0x00,  0x8a,  0x00,  0x8b,  0x00);
    vpatch(rom, 0x01675,   15,  0x00,  0x72,  0x00,  0x74,  0x00,  0x76,  0x00,  0x88,  0x00,  0x89,  0x00,  0x8a,  0x00,  0x8b,  0x00);
    vpatch(rom, 0x0188a,    5,  0x33,  0x52,  0x2d,  0xcf,  0x58);
    vpatch(rom, 0x01a8d,    1,  0x07);
    vpatch(rom, 0x01a96,    1,  0x12);
    vpatch(rom, 0x07b7e,    6,  0x1e,  0x12,  0x16,  0x18,  0x17,  0x0d);
    vpatch(rom, 0x08fbc,   11,  0x5f,  0x2a,  0x1e,  0x12,  0x16,  0x18,  0x17,  0x0d,  0x52,  0x5f,  0x5f);
    vpatch(rom, 0x0941d,   36,  0x5f,  0x2a,  0x1e,  0x12,  0x16,  0x18,  0x17,  0x0d,  0x5f,  0x12,  0x1c,  0x5f,  0x11,  0x12,  0x0d,  0x0d,  0x0e,  0x17,  0x5f,  0x0a,  0x20,  0x0a,  0x22,  0x5f,  0x12,  0x17,  0x5f,  0x0a,  0x5f,  0x0c,  0x0a,  0x1f,  0x0e,  0x52,  0x5f,  0x5f);
    vpatch(rom, 0x09523,   36,  0x5f,  0x20,  0x0a,  0x1c,  0x5f,  0x14,  0x12,  0x0d,  0x17,  0x0a,  0x19,  0x19,  0x0e,  0x0d,  0x5f,  0x0a,  0x17,  0x0d,  0x5f,  0x1d,  0x0a,  0x14,  0x0e,  0x17,  0x5f,  0x0e,  0x0a,  0x1c,  0x1d,  0x20,  0x0a,  0x1b,  0x0d,  0x52,  0x5f,  0x5f);
    vpatch(rom, 0x09e5c,   12,  0x5f,  0x2a,  0x1e,  0x12,  0x16,  0x18,  0x17,  0x0d,  0x4b,  0x40,  0x5f,  0x5f);
    vpatch(rom, 0x09e89,    3,  0x52,  0x5f,  0x5f);
    vpatch(rom, 0x09e9e,    6,  0x1e,  0x12,  0x16,  0x18,  0x17,  0x0d);
    vpatch(rom, 0x09ee1,    8,  0x18,  0x17,  0x15,  0x22,  0x5f,  0x22,  0x18,  0x17);
    /* this NPC has been removed and the text re-used.*/
#if 0
    vpatch(rom, 0x09f5b,   12,  0x5f,  0x2a,  0x1e,  0x12,  0x16,  0x18,  0x17,  0x0d,  0x4b,  0x40,  0x5f,  0x5f);
    vpatch(rom, 0x09f96,   30,  0x5f,  0x20,  0x0a,  0x1c,  0x5f,  0x14,  0x12,  0x0d,  0x17,  0x0a,  0x19,  0x19,  0x0e,  0x0d,  0x5f,  0x0b,  0x22,  0x5f,  0x1d,  0x11,  0x0e,  0x5f,  0x0e,  0x17,  0x0e,  0x16,  0x22,  0x52,  0x5f,  0x5f);
#endif
    vpatch(rom, 0x0a012,    3,  0x52,  0x5f,  0x5f);
    vpatch(rom, 0x0a46c,   16,  0x1e,  0x12,  0x16,  0x18,  0x17,  0x0d,  0x48,  0x5f,  0x18,  0x17,  0x15,  0x22,  0x5f,  0x1c,  0x18,  0x17);
    vpatch(rom, 0x0a49f,   25,  0x5f,  0x2a,  0x1e,  0x12,  0x16,  0x18,  0x17,  0x0d,  0x5f,  0x0e,  0x16,  0x0b,  0x1b,  0x0a,  0x0c,  0x0e,  0x1c,  0x5f,  0x1d,  0x11,  0x0e,  0x0e,  0x47,  0x5f,  0x5f);
    vpatch(rom, 0x0a4fb,    8,  0x18,  0x17,  0x15,  0x22,  0x5f,  0x1c,  0x18,  0x17);
    vpatch(rom, 0x0a511,    2,  0x12,  0x1c);
    vpatch(rom, 0x0a537,    6,  0x1e,  0x12,  0x16,  0x18,  0x17,  0x0d);
    vpatch(rom, 0x0a552,    6,  0x1e,  0x12,  0x16,  0x18,  0x17,  0x0d);
    vpatch(rom, 0x0abaf,    6,  0x1e,  0x12,  0x16,  0x18,  0x17,  0x0d);
    vpatch(rom, 0x0b540,    6,  0x1e,  0x12,  0x16,  0x18,  0x17,  0x0d);
    vpatch(rom, 0x0b9dd,    6,  0x1e,  0x12,  0x16,  0x18,  0x17,  0x0d);
    vpatch(rom, 0x11a90,   64,  0xe4,  0xf8,  0x1b,  0x00,  0x65,  0x4d,  0x07,  0x31,  0xcf,  0xc7,  0xe4,  0x0f,  0xea,  0xf2,  0xf8,  0x0e,  0xf0,  0xfb,  0x60,  0x04,  0xec,  0xef,  0x0e,  0x00,  0x8f,  0x94,  0x9f,  0x1b,  0xf3,  0xe1,  0xe1,  0x0e,  0x37,  0x1f,  0xd8,  0x00,  0xaf,  0xb3,  0xe0,  0x84,  0xf3,  0xe3,  0x27,  0xf0,  0x5f,  0x4f,  0x1f,  0x78,  0x0f,  0xd7,  0x06,  0x20,  0x37,  0xff,  0x70,  0x00,  0xf1,  0x21,  0xf1,  0xd8,  0xcf,  0x8f,  0x8f,  0x70);
    vpatch(rom, 0x12180,   64,  0x02,  0x06,  0x06,  0x0e,  0x06,  0x3f,  0x7f,  0x1f,  0x23,  0x3f,  0x1f,  0x0f,  0x0f,  0x3f,  0x7f,  0x3f,  0x07,  0x0e,  0x02,  0x1f,  0x0f,  0x0f,  0x0f,  0x1f,  0x07,  0x0f,  0x1f,  0x1f,  0x05,  0x04,  0x01,  0x03,  0x0f,  0x64,  0x6f,  0x1b,  0x13,  0x0e,  0x0e,  0x00,  0x7f,  0x0f,  0x0f,  0x1f,  0x1f,  0x00,  0x0e,  0x00,  0xf0,  0x26,  0xf6,  0xd8,  0xc8,  0x00,  0xf0,  0xf0,  0xfe,  0xf0,  0xf0,  0xf8,  0xf8,  0xf0,  0x00,  0xf0);
    vpatch(rom, 0x12200,   32,  0x03,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0x07,  0x1f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0xc0,  0xf0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xf8,  0xe0,  0xf8,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xf8);
    vpatch(rom, 0x12240,   96,  0x2f,  0x27,  0x10,  0x07,  0x02,  0x02,  0x04,  0x04,  0x1f,  0x1f,  0x0f,  0x07,  0x0f,  0x1f,  0x1f,  0x3f,  0xf0,  0xe4,  0x0c,  0xec,  0x4c,  0x20,  0x20,  0x10,  0xf8,  0xf8,  0xf0,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0x07,  0x0d,  0x1e,  0x1d,  0x3f,  0x3f,  0x3f,  0x3f,  0x07,  0x0f,  0x1f,  0x1f,  0x3f,  0x3f,  0x3e,  0x3f,  0x40,  0x80,  0x60,  0xf0,  0xf0,  0xe0,  0xe0,  0xe0,  0xe0,  0xe0,  0xe0,  0xf0,  0xd0,  0x40,  0x40,  0x00,  0x1c,  0x1b,  0x01,  0x07,  0x02,  0x04,  0x04,  0x08,  0x1f,  0x1c,  0x0e,  0x06,  0x0f,  0x1f,  0x1f,  0x3f,  0xc0,  0xc0,  0x80,  0xe0,  0x40,  0x40,  0x20,  0x20,  0x00,  0x00,  0x60,  0x60,  0xf0,  0xf0,  0xf8,  0xf8);
    vpatch(rom, 0x12300,  640,  0x07,  0x0d,  0x1e,  0x1d,  0x3f,  0x3f,  0x3f,  0x3f,  0x07,  0x0f,  0x1f,  0x1f,  0x3f,  0x3f,  0x3e,  0x3f,  0x40,  0x80,  0x60,  0xf0,  0xf0,  0xe0,  0xe0,  0xe0,  0xe0,  0xe0,  0xe0,  0xf0,  0xd0,  0x40,  0x40,  0x00,  0x1c,  0x1b,  0x02,  0x07,  0x03,  0x02,  0x04,  0x04,  0x1f,  0x1c,  0x0d,  0x04,  0x0c,  0x1f,  0x1f,  0x3f,  0xc0,  0x60,  0x00,  0xe0,  0x40,  0x20,  0x20,  0x10,  0x80,  0xe0,  0xe0,  0xe0,  0xf0,  0xf0,  0xf8,  0xf8,  0x02,  0x0c,  0x03,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x07,  0x1f,  0x0f,  0x1f,  0x1f,  0x1a,  0x12,  0x18,  0x40,  0x30,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xe0,  0xf8,  0xf0,  0xf8,  0xf8,  0x58,  0x48,  0x18,  0x23,  0x23,  0x10,  0x07,  0x02,  0x02,  0x04,  0x04,  0x1e,  0x1f,  0x0f,  0x07,  0x0f,  0x1f,  0x1f,  0x3f,  0xc0,  0xc4,  0x0c,  0xec,  0x4c,  0x20,  0x20,  0x10,  0x78,  0xf8,  0xf0,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0x06,  0x06,  0x0e,  0x0f,  0x0f,  0x01,  0x0f,  0x0c,  0x0f,  0x3f,  0x7f,  0x6f,  0x6f,  0x47,  0x0f,  0x0f,  0xe0,  0x70,  0x40,  0xf8,  0xf0,  0xf0,  0xf0,  0xe0,  0xe0,  0xf0,  0xf8,  0xf8,  0xa0,  0x20,  0x80,  0x80,  0x08,  0x03,  0x0f,  0x1b,  0x13,  0x0e,  0x0e,  0x00,  0x0f,  0x0c,  0x08,  0x1f,  0x1f,  0x00,  0x0e,  0x00,  0xf8,  0x20,  0xf0,  0xd8,  0xc8,  0x00,  0xf0,  0xf0,  0xe0,  0xf0,  0xf0,  0xf8,  0xf8,  0xf0,  0x00,  0xf0,  0x0c,  0x06,  0x0f,  0x1b,  0x13,  0x00,  0x0f,  0x0f,  0x0f,  0x0f,  0x0f,  0x1f,  0x1f,  0x0f,  0x00,  0x0f,  0x70,  0x70,  0xb0,  0xd8,  0xc8,  0x70,  0x70,  0x00,  0x90,  0x90,  0xf0,  0xf8,  0xf8,  0x00,  0x70,  0x00,  0x03,  0x07,  0x04,  0x0f,  0x0f,  0x3f,  0x7f,  0x1f,  0x23,  0x3f,  0x1f,  0x0f,  0x0a,  0x32,  0x78,  0x26,  0xc0,  0xe0,  0x20,  0xf0,  0xf0,  0xfc,  0xfe,  0xf8,  0xc4,  0xfc,  0xf8,  0xf0,  0x50,  0x4c,  0x1e,  0x7c,  0x03,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0x07,  0x1f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0xc0,  0xf0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xf8,  0xe0,  0xf8,  0xf2,  0xfa,  0xfa,  0xfa,  0xfa,  0xfa,  0x2f,  0x27,  0x10,  0x07,  0x02,  0x02,  0x04,  0x04,  0x1f,  0x1f,  0x0f,  0x07,  0x0f,  0x1f,  0x1f,  0x3f,  0xf0,  0xe0,  0x0c,  0xfe,  0x46,  0x20,  0x20,  0x10,  0xfa,  0xfe,  0xf2,  0xf0,  0xf0,  0xf8,  0xf8,  0xf8,  0x03,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0x07,  0x1f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0xc0,  0xf0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xf8,  0xe2,  0xfa,  0xf2,  0xfa,  0xfa,  0xfa,  0xfa,  0xfa,  0x0f,  0x27,  0x30,  0x37,  0x32,  0x04,  0x04,  0x08,  0x1f,  0x1f,  0x0f,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0xf0,  0xe2,  0x0a,  0xec,  0x4c,  0x40,  0x20,  0x20,  0xfe,  0xfc,  0xf4,  0xe2,  0xf0,  0xf8,  0xf8,  0xfc,  0x07,  0x0d,  0x1e,  0x1d,  0x3f,  0x3f,  0x3f,  0x3f,  0x07,  0x0f,  0x1f,  0x1f,  0x3f,  0x3f,  0x3e,  0x3f,  0x40,  0x80,  0x60,  0xb0,  0xb0,  0xa0,  0xa0,  0xa0,  0xe0,  0xe0,  0xe0,  0xf0,  0xd0,  0x40,  0x40,  0x40,  0x1c,  0x1b,  0x02,  0x07,  0x03,  0x02,  0x04,  0x04,  0x1f,  0x1c,  0x0d,  0x04,  0x0c,  0x1f,  0x1f,  0x3f,  0xc0,  0x60,  0x00,  0xe0,  0x40,  0x20,  0x20,  0x10,  0x80,  0xe0,  0xe0,  0xe0,  0xf0,  0xf0,  0xf8,  0xf8,  0x07,  0x0d,  0x1e,  0x1d,  0x3f,  0x3f,  0x3f,  0x3f,  0x07,  0x0f,  0x1f,  0x1f,  0x3f,  0x3f,  0x3e,  0x3f,  0x40,  0x00,  0x60,  0x70,  0x70,  0x60,  0xa0,  0xa0,  0xe0,  0xe0,  0xe0,  0xf0,  0xd0,  0xc0,  0x40,  0x40,  0x1c,  0x1b,  0x01,  0x07,  0x02,  0x04,  0x04,  0x08,  0x1f,  0x1c,  0x0e,  0x07,  0x0f,  0x1f,  0x1f,  0x3f,  0xc0,  0xe0,  0x80,  0xe0,  0x40,  0x40,  0x20,  0x20,  0x00,  0x20,  0x60,  0xe0,  0xf0,  0xf0,  0xf8,  0xf8,  0x02,  0x0c,  0x03,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x07,  0x5f,  0x4f,  0x5f,  0x5f,  0x5a,  0x52,  0x58,  0x40,  0x30,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xe0,  0xf8,  0xf0,  0xf8,  0xf8,  0x58,  0x48,  0x18,  0xb3,  0xb3,  0x10,  0x07,  0x02,  0x02,  0x04,  0x04,  0x4e,  0x4f,  0x0f,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0xc0,  0xc4,  0x0c,  0xec,  0x4c,  0x20,  0x20,  0x10,  0x78,  0xf8,  0xf0,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0x02,  0x0c,  0x03,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x07,  0x1f,  0x4f,  0x5f,  0x5f,  0x5a,  0x52,  0x58,  0x40,  0x30,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xe0,  0xf8,  0xf0,  0xf8,  0xf8,  0x58,  0x48,  0x18,  0x03,  0x23,  0xb0,  0xc7,  0x02,  0x04,  0x04,  0x08,  0x5e,  0x5f,  0x4f,  0x07,  0x0f,  0x1f,  0x1f,  0x3f,  0xc4,  0xc4,  0x08,  0xe0,  0x40,  0x40,  0x20,  0x20,  0x78,  0xf8,  0xf0,  0xe0,  0xf0,  0xf8,  0xf8,  0xfc);
    vpatch(rom, 0x12600,   16,  0x03,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0x07,  0x1f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f);
    vpatch(rom, 0x12620,   16,  0x2f,  0x27,  0x10,  0x07,  0x02,  0x02,  0x04,  0x04,  0x1f,  0x1f,  0x0f,  0x07,  0x0f,  0x1f,  0x1f,  0x3f);
    vpatch(rom, 0x12640,   16,  0x03,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0x07,  0x1f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f);
    vpatch(rom, 0x12661,   15,  0xc7,  0xd0,  0x37,  0x32,  0x04,  0x04,  0x08,  0x7f,  0x7f,  0xef,  0xc7,  0x0f,  0x1f,  0x1f,  0x3f);
    vpatch(rom, 0x12710,   16,  0x40,  0x30,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xe0,  0xf8,  0xf0,  0xf8,  0xf8,  0x58,  0x48,  0x18);
    vpatch(rom, 0x12731,   15,  0xdc,  0x1c,  0xdc,  0x40,  0x20,  0x20,  0x10,  0x7e,  0xf6,  0xf6,  0xfe,  0xfc,  0xf8,  0xfc,  0xfe);
    vpatch(rom, 0x12750,   16,  0x40,  0x30,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf6,  0xe0,  0xf8,  0xf0,  0xf8,  0xf8,  0x58,  0x4e,  0x1e);
    vpatch(rom, 0x12770,   16,  0xc3,  0xc3,  0x0b,  0xe0,  0x40,  0x40,  0x20,  0x20,  0x7e,  0xfe,  0xf7,  0xe3,  0xf0,  0xf8,  0xf8,  0xfc);
    vpatch(rom, 0x12800,   16,  0x03,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0x07,  0x1f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f);
    vpatch(rom, 0x12820,   16,  0x2f,  0x27,  0x10,  0x07,  0x02,  0x02,  0x04,  0x04,  0x1f,  0x1f,  0x2f,  0x07,  0x0f,  0x1f,  0x1f,  0x3f);
    vpatch(rom, 0x12840,   15,  0x03,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0xdf,  0x07,  0x1f,  0x0f,  0x1f,  0x1f,  0x1f,  0xdf);
    vpatch(rom, 0x12861,   15,  0xc7,  0xd0,  0x37,  0x22,  0x04,  0x04,  0x08,  0x7f,  0x7f,  0xef,  0xc7,  0x0f,  0x1f,  0x1f,  0x3f);
    vpatch(rom, 0x12910,   16,  0x40,  0x30,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf0,  0xe0,  0xf8,  0xf0,  0xf8,  0xf8,  0x58,  0x48,  0x1e);
    vpatch(rom, 0x12930,   16,  0xce,  0xce,  0x0e,  0xee,  0x40,  0x20,  0x20,  0x10,  0x7f,  0xfb,  0xfb,  0xff,  0xfe,  0xf0,  0xf8,  0xfc);
    vpatch(rom, 0x12950,   16,  0x40,  0x30,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xfb,  0xe0,  0xf8,  0xf0,  0xf8,  0xf8,  0x58,  0x4b,  0x1f);
    vpatch(rom, 0x12970,  144,  0xc3,  0xc3,  0x0b,  0xe0,  0x40,  0x40,  0x20,  0x20,  0x7e,  0xfe,  0xf7,  0xe3,  0xf0,  0xf8,  0xf8,  0xfc,  0x02,  0x01,  0x06,  0x0f,  0x0f,  0x07,  0x07,  0x03,  0x07,  0x07,  0x07,  0x0f,  0x0b,  0x02,  0x02,  0x0c,  0xe0,  0xb0,  0x78,  0xb8,  0xfc,  0xfc,  0xfc,  0xfc,  0xe0,  0xf0,  0xf8,  0xf8,  0xfc,  0xfc,  0x7c,  0xfc,  0x0d,  0x0d,  0x0d,  0x0d,  0x02,  0x02,  0x04,  0x04,  0x0e,  0x06,  0x06,  0x0f,  0x0f,  0x0f,  0x1f,  0x1f,  0x38,  0xd8,  0x80,  0xe0,  0x40,  0x20,  0x20,  0x10,  0xf8,  0x38,  0x70,  0xe0,  0xf0,  0xf8,  0xf8,  0xfc,  0x02,  0x01,  0x06,  0x0f,  0x0f,  0x07,  0x04,  0x03,  0x07,  0x07,  0x07,  0x0f,  0x0b,  0x02,  0x03,  0x07,  0xe0,  0xb0,  0x78,  0xb8,  0xfc,  0xfc,  0x7c,  0xbc,  0xe0,  0xf0,  0xf8,  0xf8,  0xfc,  0xfc,  0xfc,  0xfc,  0x03,  0x03,  0x03,  0x04,  0x02,  0x04,  0x04,  0x08,  0x06,  0x06,  0x07,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0xb8,  0x98,  0x80,  0x60,  0xc0,  0x40,  0x20,  0x20,  0xf8,  0xf8,  0xf0,  0xa0,  0x30,  0xf8,  0xf8,  0xfc);
    vpatch(rom, 0x12a20,  123,  0x2f,  0xa7,  0xd0,  0x47,  0x02,  0x04,  0x04,  0x08,  0x5f,  0x5f,  0x2f,  0x07,  0x0f,  0x1f,  0x1f,  0x3f,  0xf0,  0xe0,  0x0c,  0xfc,  0x40,  0x40,  0x20,  0x20,  0xf8,  0xfe,  0xf2,  0xf0,  0xf0,  0xf0,  0xf8,  0xf8,  0x03,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0x07,  0x1f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0xc0,  0xf0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xf8,  0xe0,  0xfa,  0xfe,  0xfe,  0xfc,  0xf8,  0xf8,  0xf8,  0x2f,  0x27,  0xb0,  0xc7,  0x42,  0x02,  0x04,  0x04,  0x1f,  0x5f,  0x4f,  0x27,  0x0f,  0x1f,  0x1f,  0x3f,  0xf4,  0xe4,  0x08,  0xe0,  0x40,  0x20,  0x20,  0x10,  0xf8,  0xf8,  0xf0,  0xe0,  0xf0,  0xf8,  0xf8,  0xfc,  0x30,  0x18,  0x26,  0x1f,  0x3f,  0x3f,  0x3f,  0x7f,  0x3a,  0x3f,  0x3f,  0x3f,  0x3d,  0x39,  0x38,  0x78,  0x00,  0x24,  0x30,  0xb3,  0xf3,  0xff,  0xff,  0xff,  0x99,  0xff,  0x7e);
    vpatch(rom, 0x12aa0,   59,  0x60,  0x63,  0x43,  0x3f,  0x2a,  0x4a,  0x49,  0x11,  0x7f,  0x7c,  0x7c,  0x3f,  0x3f,  0x7f,  0x7f,  0xff,  0x3c,  0xff,  0xff,  0x44,  0xff,  0x7c,  0x00,  0x00,  0x7e,  0xff,  0x1f,  0xff,  0xff,  0x7c,  0x80,  0x80,  0x30,  0x18,  0x26,  0x1f,  0x3f,  0x3f,  0x3f,  0x3f,  0x3b,  0x3f,  0x3f,  0x3f,  0x3d,  0x39,  0x38,  0x38,  0x00,  0x24,  0x0c,  0x8f,  0xcf,  0xff,  0xff,  0xff,  0x99,  0xff,  0x7e);
    vpatch(rom, 0x12ae0,   32,  0x20,  0x23,  0x03,  0x3f,  0x2a,  0x2a,  0x49,  0x11,  0x3f,  0x3c,  0x3c,  0x3f,  0x3f,  0x3f,  0x7f,  0x7f,  0x3c,  0xff,  0xff,  0x44,  0xff,  0x99,  0x00,  0x00,  0x7e,  0xff,  0x1f,  0xff,  0xff,  0xff,  0x80,  0x80);
    vpatch(rom, 0x12b20,  256,  0x6f,  0x67,  0x3f,  0x1f,  0x0f,  0x00,  0x00,  0x00,  0x7e,  0x7c,  0x1f,  0x0f,  0x0f,  0x0f,  0x0f,  0x1f,  0xf0,  0xf8,  0x70,  0xe0,  0x62,  0x16,  0x0c,  0x00,  0x70,  0x78,  0xf8,  0xbc,  0x9c,  0xf8,  0xf8,  0xf8,  0x0c,  0x2e,  0x67,  0x63,  0x7f,  0x7f,  0x3f,  0x7f,  0x1d,  0x3f,  0x7f,  0x7f,  0x7f,  0x72,  0x32,  0x70,  0x40,  0x30,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xe0,  0xf8,  0xf0,  0xf8,  0xf8,  0x58,  0x48,  0x18,  0x6f,  0x67,  0x3f,  0x1f,  0x0f,  0x00,  0x00,  0x00,  0x7e,  0x7c,  0x1f,  0x0f,  0x0f,  0x0f,  0x0f,  0x0f,  0xf0,  0xf8,  0x70,  0xe0,  0x62,  0x16,  0x0c,  0x00,  0x70,  0x78,  0xf8,  0xbc,  0x9c,  0xf8,  0xf8,  0xfc,  0x1e,  0x3e,  0x1d,  0x23,  0xff,  0xff,  0xff,  0xff,  0x9f,  0xff,  0xff,  0x7f,  0xfe,  0xca,  0x8a,  0xc0,  0x0c,  0x18,  0x64,  0xf8,  0xfc,  0xfc,  0xfc,  0xfc,  0x5c,  0xfc,  0xfc,  0xfc,  0xbc,  0x9c,  0x1c,  0x1c,  0xbf,  0x6e,  0xdd,  0x7f,  0x3f,  0x07,  0x07,  0x00,  0xf1,  0xff,  0xff,  0x73,  0x03,  0x0f,  0x1f,  0x1f,  0x08,  0x9c,  0xf8,  0xd0,  0x80,  0x88,  0x58,  0x30,  0xf0,  0xe0,  0xe0,  0xe0,  0xf0,  0xf0,  0xe0,  0xcc,  0x1e,  0x3e,  0x1d,  0x23,  0xff,  0xff,  0xff,  0xff,  0x9f,  0xff,  0xff,  0x7f,  0xfe,  0xca,  0x8a,  0xc0,  0x0c,  0x18,  0x64,  0xf8,  0xfc,  0xfc,  0xfc,  0xfe,  0x5c,  0xfc,  0xfc,  0xfc,  0xbc,  0x9c,  0x1c,  0x1e,  0xbf,  0x6e,  0xdd,  0x7f,  0x3f,  0x07,  0x03,  0x00,  0xf1,  0xff,  0xff,  0x73,  0x03,  0x0f,  0x1f,  0x1f,  0x08,  0x9c,  0xf8,  0xd0,  0xc0,  0x88,  0x58,  0x30,  0xf0,  0xe0,  0xe0,  0xe0,  0xf0,  0xf0,  0xe0,  0xc8,  0x0f,  0x32,  0x3f,  0x1b,  0x13,  0x00,  0x0f,  0x0f,  0x3f,  0x0f,  0x0f,  0x1f,  0x1f,  0x0f,  0x00,  0x0f,  0xf0,  0x4c,  0xfc,  0xd8,  0xc8,  0x70,  0x70,  0x00,  0xfc,  0xf0,  0xf0,  0xf8,  0xf8,  0x00,  0x70,  0x00);
}